

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase309::run(TestCase309 *this)

{
  Reader reader_00;
  Builder builder_00;
  size_t sVar1;
  size_t sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  TestPipe pipe;
  PackedMessageReader reader;
  TestMessageBuilder builder;
  undefined1 local_310 [8];
  OutputStream OStack_308;
  WirePointer *local_300;
  _Alloc_hider local_2f8;
  uchar *local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  size_type local_2d8;
  Reader local_2d0;
  StructBuilder local_2b0;
  PointerReader local_288;
  SegmentReader *local_268;
  CapTableReader *pCStack_260;
  void *local_258;
  WirePointer *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined1 local_228 [296];
  TestMessageBuilder local_100;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_100.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_00378da8;
  local_100.desiredSegmentCount = 7;
  MessageBuilder::getRootInternal((Builder *)local_310,(MessageBuilder *)&local_100);
  local_228._0_8_ = local_300;
  PointerBuilder::initStruct
            (&local_2b0,(PointerBuilder *)&stack0xfffffffffffffdc8,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdb8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdb0;
  builder_00._builder.data = (void *)in_stack_fffffffffffffdc0;
  builder_00._builder.pointers = (WirePointer *)local_310;
  builder_00._builder._32_8_ = OStack_308._vptr_OutputStream;
  initTestMessage(builder_00);
  paVar3 = &local_2e8;
  local_310 = (undefined1  [8])&PTR__TestPipe_00378cd0;
  OStack_308._vptr_OutputStream = (_func_int **)&PTR__TestPipe_00378d10;
  local_300 = (WirePointer *)0x1;
  local_2f0 = (uchar *)0x0;
  local_2e8._M_local_buf[0] = '\0';
  local_2d8 = 0;
  local_2f8._M_p = (pointer)paVar3;
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  segments.size_ = (size_t)paVar3;
  writePackedMessage((capnp *)&OStack_308,(OutputStream *)AVar4.ptr,segments);
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments_00.size_ = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  segments_00.ptr = segments_00.size_;
  sVar1 = computeSerializedSizeInWords((capnp *)AVar4.ptr,segments_00);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = local_2f0;
  sVar2 = computeUnpackedSizeInWords((capnp *)local_2f8._M_p,packedBytes);
  local_228._0_8_ = " == ";
  local_228._8_8_ = 5;
  local_228[0x10] = sVar1 == sVar2;
  if ((!local_228[0x10]) && (kj::_::Debug::minSeverity < 3)) {
    AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
    segments_01.size_ = (ArrayPtr<const_capnp::word> *)AVar4.size_;
    segments_01.ptr = segments_01.size_;
    local_288.segment =
         (SegmentReader *)computeSerializedSizeInWords((capnp *)AVar4.ptr,segments_01);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = local_2f0;
    local_2d0.reader.segment =
         (SegmentReader *)computeUnpackedSizeInWords((capnp *)local_2f8._M_p,packedBytes_00);
    kj::_::Debug::
    log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x13c,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(DebugComparison<unsigned_long,_unsigned_long> *)&stack0xfffffffffffffdc8,
               (unsigned_long *)&local_288,(unsigned_long *)&local_2d0);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  PackedMessageReader::PackedMessageReader
            ((PackedMessageReader *)&stack0xfffffffffffffdc8,(BufferedInputStream *)local_310,
             options,(ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRootInternal(&local_2d0,(MessageReader *)local_228);
  local_288.pointer = local_2d0.reader.pointer;
  local_288.nestingLimit = local_2d0.reader.nestingLimit;
  local_288._28_4_ = local_2d0.reader._28_4_;
  local_288.segment = local_2d0.reader.segment;
  local_288.capTable = local_2d0.reader.capTable;
  PointerReader::getStruct((StructReader *)&local_268,&local_288,(word *)0x0);
  reader_00._reader.capTable = pCStack_260;
  reader_00._reader.segment = local_268;
  reader_00._reader.data = local_258;
  reader_00._reader.pointers = in_stack_fffffffffffffdb0;
  reader_00._reader.dataSize = (StructDataBitCount)in_stack_fffffffffffffdb8;
  reader_00._reader.pointerCount = SUB82(in_stack_fffffffffffffdb8,4);
  reader_00._reader._38_2_ = SUB82(in_stack_fffffffffffffdb8,6);
  reader_00._reader.nestingLimit = (int)in_stack_fffffffffffffdc0;
  reader_00._reader._44_4_ = SUB84(in_stack_fffffffffffffdc0,4);
  checkTestMessage(reader_00);
  PackedMessageReader::~PackedMessageReader((PackedMessageReader *)&stack0xfffffffffffffdc8);
  TestPipe::~TestPipe((TestPipe *)local_310);
  TestMessageBuilder::~TestMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Packed, RoundTripOddSegmentCountLazy) {
  TestMessageBuilder builder(7);
  initTestMessage(builder.initRoot<TestAllTypes>());

  TestPipe pipe(1);
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessage(reader.getRoot<TestAllTypes>());
}